

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsViewPrivate::clearRubberBand(QGraphicsViewPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QAbstractScrollArea *this_00;
  QRegionData *pQVar5;
  ViewportUpdateMode VVar6;
  QWidget *this_01;
  QWidget *rect;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  int iVar8;
  undefined1 auVar7 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined8 *local_38;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->dragMode != RubberBandDrag) || ((this->field_0x300 & 1) == 0)) ||
     (this->rubberBanding != true)) goto LAB_0062ea00;
  this_00 = *(QAbstractScrollArea **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  VVar6 = this->viewportUpdateMode;
  if (VVar6 == FullViewportUpdate) {
    QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
    this->field_0x301 = this->field_0x301 | 0x10;
    (this->dirtyBoundingRect).x1 = 0;
    (this->dirtyBoundingRect).y1 = 0;
    (this->dirtyBoundingRect).x2 = -1;
    (this->dirtyBoundingRect).y2 = -1;
    QRegion::QRegion((QRegion *)local_48);
    pQVar5 = (this->dirtyRegion).d;
    (this->dirtyRegion).d = (QRegionData *)local_48._0_8_;
    local_48._0_8_ = pQVar5;
LAB_0062e965:
    VVar6 = QRegion::~QRegion((QRegion *)local_48);
  }
  else if (VVar6 != NoViewportUpdate) {
    this_01 = QAbstractScrollArea::viewport(this_00);
    rect = QAbstractScrollArea::viewport(this_00);
    rubberBandRegion((QGraphicsViewPrivate *)local_48,in_RSI,(QRect *)rect);
    QWidget::update(this_01,(QRegion *)local_48);
    goto LAB_0062e965;
  }
  this->rubberBanding = false;
  this->rubberBandSelectionOperation = ReplaceSelection;
  uVar1 = (this->rubberBandRect).x1;
  uVar3 = (this->rubberBandRect).y1;
  uVar2 = (this->rubberBandRect).x2;
  uVar4 = (this->rubberBandRect).y2;
  auVar7._0_4_ = -(uint)(uVar2 == uVar1 + -1);
  iVar8 = -(uint)(uVar4 == uVar3 + -1);
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = iVar8;
  auVar7._12_4_ = iVar8;
  iVar8 = movmskpd(VVar6,auVar7);
  if (iVar8 != 3) {
    (this->rubberBandRect).x1 = 0;
    (this->rubberBandRect).y1 = 0;
    (this->rubberBandRect).x2 = -1;
    (this->rubberBandRect).y2 = -1;
    local_48._8_8_ = &local_58;
    local_58 = 0;
    uStack_50 = 0xffffffffffffffff;
    local_38 = &local_68;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_48._0_8_ = (QRegionData *)0x0;
    local_30 = (undefined1 *)&local_78;
    QMetaObject::activate((QObject *)this_00,&QGraphicsView::staticMetaObject,0,(void **)local_48);
  }
LAB_0062ea00:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::clearRubberBand()
{
    Q_Q(QGraphicsView);
    if (dragMode != QGraphicsView::RubberBandDrag || !sceneInteractionAllowed || !rubberBanding)
        return;

    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }

    rubberBanding = false;
    rubberBandSelectionOperation = Qt::ReplaceSelection;
    if (!rubberBandRect.isNull()) {
        rubberBandRect = QRect();
        emit q->rubberBandChanged(rubberBandRect, QPointF(), QPointF());
    }
}